

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SyntaxFacts.cpp
# Opt level: O3

SyntaxKind slang::syntax::SyntaxFacts::getIntegerType(TokenKind kind)

{
  undefined2 in_register_0000003a;
  int iVar1;
  
  iVar1 = CONCAT22(in_register_0000003a,kind);
  if (iVar1 < 0xd3) {
    if (iVar1 < 0xc5) {
      if (iVar1 == 0x6d) {
        return BitType;
      }
      if (iVar1 == 0x72) {
        return ByteType;
      }
    }
    else {
      if (iVar1 == 0xc5) {
        return IntType;
      }
      if (iVar1 == 0xc6) {
        return IntegerType;
      }
    }
  }
  else if (iVar1 < 0x101) {
    if (iVar1 == 0xd3) {
      return LogicType;
    }
    if (iVar1 == 0xd4) {
      return LongIntType;
    }
  }
  else {
    if (iVar1 == 0x101) {
      return RegType;
    }
    if (iVar1 == 0x113) {
      return ShortIntType;
    }
    if (iVar1 == 300) {
      return TimeType;
    }
  }
  return Unknown;
}

Assistant:

SyntaxKind SyntaxFacts::getIntegerType(TokenKind kind) {
    switch (kind) {
        case TokenKind::BitKeyword: return SyntaxKind::BitType;
        case TokenKind::LogicKeyword: return SyntaxKind::LogicType;
        case TokenKind::RegKeyword: return SyntaxKind::RegType;
        case TokenKind::ByteKeyword: return SyntaxKind::ByteType;
        case TokenKind::ShortIntKeyword: return SyntaxKind::ShortIntType;
        case TokenKind::IntKeyword: return SyntaxKind::IntType;
        case TokenKind::LongIntKeyword: return SyntaxKind::LongIntType;
        case TokenKind::IntegerKeyword: return SyntaxKind::IntegerType;
        case TokenKind::TimeKeyword: return SyntaxKind::TimeType;
        default: return SyntaxKind::Unknown;
    }
}